

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwPortTest.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  AmpIO *pAVar5;
  ostream *poVar6;
  size_t i;
  undefined1 auVar7 [8];
  uint32_t sdata;
  __time_t _Var8;
  size_t j;
  long lVar9;
  ulong uVar10;
  long lVar11;
  __suseconds_t *p_Var12;
  timeval local_d48 [99];
  undefined1 *puStack_710;
  undefined1 local_708 [8];
  FirewirePort fwport;
  stringstream debugStream;
  ios_base local_190 [264];
  int aiStack_88 [2];
  int board_id [4];
  undefined1 local_60 [8];
  timeval start;
  char short_options [4];
  quadlet_t dataQuadlet;
  vector<AmpIO_*,_std::allocator<AmpIO_*>_> BoardList;
  
  _short_options = (void *)0x0;
  aiStack_88[0] = 2;
  aiStack_88[1] = 3;
  board_id[0] = 6;
  board_id[1] = 7;
  start.tv_usec._0_4_ = 0x3a7068;
  iVar3 = 0;
  do {
    puStack_710 = (undefined1 *)0x10481c;
    iVar2 = getopt(argc,argv,(char *)&start.tv_usec);
    if (iVar2 != -1) {
      if (iVar2 == 0x70) {
        puStack_710 = (undefined1 *)0x10484a;
        iVar3 = atoi(_optarg);
        puStack_710 = (undefined1 *)0x104861;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"using port number",0x11);
        puStack_710 = (undefined1 *)0x104876;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        puStack_710 = (undefined1 *)0x104881;
        std::ostream::put(-0x68);
        puStack_710 = (undefined1 *)0x104889;
        std::ostream::flush();
      }
      else {
        if (iVar2 != 0x68) {
          puStack_710 = &LAB_00104e3e;
          abort();
        }
        puStack_710 = (undefined1 *)0x104839;
        ShowUsage();
      }
    }
  } while (iVar2 != -1);
  puStack_710 = (undefined1 *)0x1048a4;
  std::__cxx11::stringstream::stringstream((stringstream *)&fwport.old_reset_handler,_S_out|_S_in);
  puStack_710 = (undefined1 *)0x1048ba;
  FirewirePort::FirewirePort((FirewirePort *)local_708,iVar3,(ostream *)&std::cout);
  if (fwport.super_BasePort.Board2Node._24_8_ == 0) {
    puStack_710 = (undefined1 *)0x104db8;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to initialize firewire port",0x22);
    puStack_710 = (undefined1 *)0x104dcc;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    puStack_710 = (undefined1 *)0x104ddb;
    std::ostream::put(-0x58);
    iVar3 = 1;
    puStack_710 = (undefined1 *)0x104de8;
    std::ostream::flush();
  }
  else {
    puStack_710 = (undefined1 *)0x1048e0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Open port on ",0xd);
    puStack_710 = (undefined1 *)0x1048f2;
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    puStack_710 = (undefined1 *)0x104909;
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    puStack_710 = (undefined1 *)0x104914;
    std::ostream::put((char)plVar4);
    puStack_710 = (undefined1 *)0x10491c;
    std::ostream::flush();
    lVar9 = 0;
    do {
      puStack_710 = (undefined1 *)0x104930;
      pAVar5 = (AmpIO *)operator_new(0xe58);
      puStack_710 = (undefined1 *)0x104944;
      AmpIO::AmpIO(pAVar5,(uint8_t)board_id[lVar9 + -2]);
      puStack_710 = (undefined1 *)0x104955;
      local_60 = (undefined1  [8])pAVar5;
      std::vector<AmpIO*,std::allocator<AmpIO*>>::emplace_back<AmpIO*>
                ((vector<AmpIO*,std::allocator<AmpIO*>> *)short_options,(AmpIO **)local_60);
      puStack_710 = (undefined1 *)0x104969;
      FirewirePort::AddBoard
                ((FirewirePort *)local_708,*(BoardIO **)((long)_short_options + lVar9 * 8));
      puStack_710 = (undefined1 *)0x104979;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"new board with node_id = ",0x19);
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      puStack_710 = (undefined1 *)0x1049ae;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      puStack_710 = (undefined1 *)0x1049c5;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      puStack_710 = (undefined1 *)0x1049d0;
      std::ostream::put((char)poVar6);
      puStack_710 = (undefined1 *)0x1049d8;
      std::ostream::flush();
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    puStack_710 = (undefined1 *)0x104a05;
    bVar1 = BasePort::WriteQuadlet((BasePort *)local_708,'?',0xffffff000003,0x88380000);
    if (!bVar1) {
      puStack_710 = (undefined1 *)0x104a24;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Quadlet broadcast error",0x17);
      puStack_710 = (undefined1 *)0x104a38;
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
      puStack_710 = (undefined1 *)0x104a47;
      std::ostream::put(-0x58);
      puStack_710 = (undefined1 *)0x104a4f;
      std::ostream::flush();
    }
    if (_short_options != (void *)0x0) {
      uVar10 = 0;
      do {
        start.tv_usec._4_4_ = 0;
        puStack_710 = (undefined1 *)0x104a92;
        BasePort::ReadQuadlet
                  ((BasePort *)local_708,
                   *(uchar *)(*(long *)((long)_short_options + uVar10 * 8) + 8),3,
                   (quadlet_t *)((long)&start.tv_usec + 4));
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
        puStack_710 = (undefined1 *)0x104ab7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Board ",6);
        puStack_710 = (undefined1 *)0x104acb;
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            (uint)*(byte *)(*(long *)((long)_short_options + uVar10 * 8) + 8));
        puStack_710 = (undefined1 *)0x104ade;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," watchdog = ",0xc);
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
        puStack_710 = (undefined1 *)0x104b02;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        puStack_710 = (undefined1 *)0x104b19;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        puStack_710 = (undefined1 *)0x104b24;
        std::ostream::put((char)poVar6);
        puStack_710 = (undefined1 *)0x104b2c;
        std::ostream::flush();
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)(-(long)_short_options >> 3));
    }
    start.tv_usec._4_4_ = 0;
    if (_short_options != (void *)0x0) {
      uVar10 = 0;
      do {
        puStack_710 = (undefined1 *)0x104b68;
        AmpIO::WriteSafetyRelay(*(AmpIO **)((long)_short_options + uVar10 * 8),true);
        puStack_710 = (undefined1 *)0x104b7a;
        AmpIO::WritePowerEnable(*(AmpIO **)((long)_short_options + uVar10 * 8),true);
        puStack_710 = (undefined1 *)0x104b84;
        usleep(40000);
        puStack_710 = (undefined1 *)0x104b9b;
        AmpIO::WriteAmpEnable(*(AmpIO **)((long)_short_options + uVar10 * 8),0xf,0xf);
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)(-(long)_short_options >> 3));
    }
    lVar9 = 0;
    do {
      pAVar5 = *(AmpIO **)((long)_short_options + lVar9 * 8);
      sdata = 0x8000;
      lVar11 = 0;
      do {
        puStack_710 = (undefined1 *)0x104bd4;
        AmpIO::SetMotorCurrent(pAVar5,(uint)lVar11,sdata);
        lVar11 = lVar11 + 1;
        sdata = sdata + 0x200;
      } while (lVar11 != 4);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    lVar9 = 0;
    gettimeofday((timeval *)local_60,(__timezone_ptr_t)0x0);
    do {
      BasePort::ReadAllBoardsBroadcast((BasePort *)local_708);
      BasePort::WriteAllBoardsBroadcast((BasePort *)local_708);
      gettimeofday((timeval *)((long)&local_d48[0].tv_sec + lVar9),(__timezone_ptr_t)0x0);
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x640);
    p_Var12 = &local_d48[0].tv_usec;
    lVar9 = 0;
    auVar7 = local_60;
    _Var8 = start.tv_sec;
    do {
      pAVar5 = (AmpIO *)((timeval *)(p_Var12 + -1))->tv_sec;
      lVar11 = *p_Var12;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time ",5);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar6 = std::ostream::_M_insert<double>
                         ((double)((long)pAVar5 - (long)auVar7) * 1000000.0 +
                          (double)(lVar11 - _Var8) + 0.5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      lVar9 = lVar9 + 1;
      p_Var12 = p_Var12 + 2;
      auVar7 = (undefined1  [8])pAVar5;
      _Var8 = lVar11;
    } while (lVar9 != 100);
    if (_short_options != (void *)0x0) {
      uVar10 = 0;
      do {
        AmpIO::WriteSafetyRelay(*(AmpIO **)((long)_short_options + uVar10 * 8),false);
        AmpIO::WriteAmpEnable(*(AmpIO **)((long)_short_options + uVar10 * 8),0xf,0);
        AmpIO::WritePowerEnable(*(AmpIO **)((long)_short_options + uVar10 * 8),false);
        FirewirePort::RemoveBoard
                  ((FirewirePort *)local_708,
                   *(uchar *)(*(long *)((long)_short_options + uVar10 * 8) + 8));
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)(-(long)_short_options >> 3));
    }
    iVar3 = 0;
  }
  puStack_710 = (undefined1 *)0x104df4;
  FirewirePort::~FirewirePort((FirewirePort *)local_708);
  puStack_710 = (undefined1 *)0x104e07;
  std::__cxx11::stringstream::~stringstream((stringstream *)&fwport.old_reset_handler);
  puStack_710 = (undefined1 *)0x104e13;
  std::ios_base::~ios_base(local_190);
  if (_short_options != (void *)0x0) {
    puStack_710 = (undefined1 *)0x104e28;
    operator_delete(_short_options,-(long)_short_options);
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv)
{
    // declare variables and default values
    int port = 0;
    const size_t numBoards = 4;
    int board_id[numBoards] = {BoardIO::MAX_BOARDS, BoardIO::MAX_BOARDS};
    std::vector<AmpIO*> BoardList;

    // set board id
    board_id[0] = 2;
    board_id[1] = 3;
    board_id[2] = 6;
    board_id[3] = 7;

    // command line option setup
    const char short_options[] = "hp:";
    int next_option;
    do {
        next_option = getopt(argc, argv, short_options);
        switch (next_option)
        {
        case 'h':
            ShowUsage();
            break;
        case 'p':
            port = atoi(optarg);
            std::cout << "using port number" << std::endl;
            break;
        case -1:  // parsing done
            break;
        default:  // should NEVER happen
            abort();
        }
    }
    while (next_option != -1);

    // ---------------------------------------------------
    // Firewire port
    // ZC: really this port number should be interactive
    // ---------------------------------------------------
    std::stringstream debugStream(std::stringstream::out|std::stringstream::in);
    FirewirePort fwport(port, std::cout);
    if (!fwport.IsOK()) {
        std::cerr << "Failed to initialize firewire port" << std::endl;
        return EXIT_FAILURE;
    } else {
        std::cout << "Open port on " << port << std::endl;
    }

    // Create AmpIO board 1 and 2
    for (size_t i = 0; i < numBoards; i++) {
        BoardList.push_back(new AmpIO(board_id[i]));
        fwport.AddBoard(BoardList[i]);
        std::cout << "new board with node_id = " << std::dec
                  << fwport.GetNodeId(board_id[i]) << std::endl;
    }

    // ----- ---------------------------------
    // Quadlet broadcast
    // ---------------------------------------
    bool rc;
    nodeaddr_t nodeaddress_wd = 0xffffff000003;
    rc = fwport.WriteQuadlet(FW_NODE_BROADCAST, nodeaddress_wd, bswap_32(0x3888));
    if (!rc) {
        std::cerr << "Quadlet broadcast error" << std::endl;
    }

    // now read back and verify
    quadlet_t dataQuadlet = 0x0000;
    for (size_t i = 0; i < BoardList.size(); i++) {
        fwport.ReadQuadlet(BoardList[i]->GetBoardId(), 0x03, dataQuadlet);
        std::cout << std::dec << "Board " << (int) BoardList[i]->GetBoardId()
                  << " watchdog = " << std::hex << bswap_32(dataQuadlet) << std::endl;
        dataQuadlet = 0x0000; // clear value
    }

    // ----- ---------------------------------
    // Block broadcast
    // --------------------------------------
    for (size_t i = 0; i < BoardList.size(); i++) {
        BoardList[i]->WriteSafetyRelay(true);
        BoardList[i]->WritePowerEnable(true);
        usleep(40000); // sleep 40 ms
        BoardList[i]->WriteAmpEnable(0x0f, 0x0f);
    }

    AmpIO* board;
    for (size_t i = 0; i < numBoards; i++) {
        board = BoardList[i];
        // set current for all boards
        for (size_t j = 0; j < 4; j++) {
            board->SetMotorCurrent(j, 0x8000 + 0x200 * j);
        }
    }

	
    // ----- ---------------------------------
    // Broadcast Write/Read boards
    // ---------------------------------------

    int counter = 0;
    int csize = 100;
    timeval start, prev;
    timeval stop[csize];

    gettimeofday(&start, NULL);
    while(counter < csize){
        counter++;
        fwport.ReadAllBoardsBroadcast();
        fwport.WriteAllBoardsBroadcast();
        gettimeofday(&stop[counter-1], NULL);
    }

    prev = start;
    for (int i = 0; i < csize; i++) {
        double mtime;
        mtime = (stop[i].tv_sec - prev.tv_sec) * 1000000.0 +
                (stop[i].tv_usec - prev.tv_usec) + 0.5;
        prev = stop[i];

        std::cout << "time " << i << " = " << std::dec << mtime << std::endl;
    }


    // Shut down boards and remove from port
    for (size_t i = 0; i < BoardList.size(); i++) {
        BoardList[i]->WriteSafetyRelay(false);
        BoardList[i]->WriteAmpEnable(0x0f, 0);   // Turn power off
        BoardList[i]->WritePowerEnable(false);   // Turn power off
        fwport.RemoveBoard(BoardList[i]->GetBoardId());
    }

    return EXIT_SUCCESS;
}